

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

int buffer_append_va(Buffer *buffer,char *fmt,__va_list_tag *va)

{
  uint uVar1;
  char *__s;
  int retval;
  char *buf;
  undefined8 uStack_148;
  int len;
  va_list ap;
  char local_128 [8];
  char scratch [256];
  __va_list_tag *va_local;
  char *fmt_local;
  Buffer *buffer_local;
  
  ap[0].overflow_arg_area = va->reg_save_area;
  uStack_148._0_4_ = va->gp_offset;
  uStack_148._4_4_ = va->fp_offset;
  ap[0]._0_8_ = va->overflow_arg_area;
  scratch._248_8_ = va;
  uVar1 = vsnprintf(local_128,0x100,fmt,&uStack_148);
  if (uVar1 == 0) {
    buffer_local._4_4_ = 1;
  }
  else if (uVar1 < 0x100) {
    buffer_local._4_4_ = buffer_append(buffer,local_128,(long)(int)uVar1);
  }
  else {
    __s = (char *)(*buffer->m)(uVar1 + 1,buffer->d);
    if (__s == (char *)0x0) {
      buffer_local._4_4_ = 0;
    }
    else {
      ap[0].overflow_arg_area = *(void **)(scratch._248_8_ + 0x10);
      uStack_148 = *(undefined8 *)scratch._248_8_;
      ap[0]._0_8_ = *(undefined8 *)(scratch._248_8_ + 8);
      vsnprintf(__s,(long)(int)(uVar1 + 1),fmt,&uStack_148);
      buffer_local._4_4_ = buffer_append(buffer,__s,(long)(int)uVar1);
      (*buffer->f)(__s,buffer->d);
    }
  }
  return buffer_local._4_4_;
}

Assistant:

int buffer_append_va(Buffer *buffer, const char *fmt, va_list va)
{
    char scratch[256];

    va_list ap;
    va_copy(ap, va);
    const int len = vsnprintf(scratch, sizeof (scratch), fmt, ap);
    va_end(ap);

    // If we overflowed our scratch buffer, heap allocate and try again.

    if (len == 0)
        return 1;  // nothing to do.
    else if (len < sizeof (scratch))
        return buffer_append(buffer, scratch, len);

    char *buf = (char *) buffer->m(len + 1, buffer->d);
    if (buf == NULL)
        return 0;
    va_copy(ap, va);
    vsnprintf(buf, len + 1, fmt, ap);  // rebuild it.
    va_end(ap);
    const int retval = buffer_append(buffer, buf, len);
    buffer->f(buf, buffer->d);
    return retval;
}